

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O1

void __thiscall gui::ColorPicker::setColor(ColorPicker *this,Color *color)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  array<float,_4UL> local_18;
  
  fVar5 = (float)color->b / 255.0;
  bVar1 = color->a;
  uVar2._0_1_ = color->r;
  uVar2._1_1_ = color->g;
  auVar7._0_4_ = (float)(uVar2 & 0xff);
  auVar7._4_4_ = (float)(byte)uVar2._1_1_;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar7,_DAT_001a5760);
  fVar6 = auVar7._0_4_;
  fVar8 = auVar7._4_4_;
  fVar9 = (float)(~-(uint)(fVar6 < fVar8) & (uint)fVar6 | (uint)fVar8 & -(uint)(fVar6 < fVar8));
  fVar10 = (float)(~-(uint)(fVar8 < fVar6) & (uint)fVar6 | (uint)fVar8 & -(uint)(fVar8 < fVar6));
  uVar3 = -(uint)(fVar9 < fVar5);
  uVar4 = -(uint)(fVar5 < fVar10);
  fVar11 = (float)(~uVar3 & (uint)fVar9 | (uint)fVar5 & uVar3);
  fVar10 = fVar11 - (float)(~uVar4 & (uint)fVar10 | (uint)fVar5 & uVar4);
  fVar9 = 0.0;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    if ((fVar11 != fVar6) || (NAN(fVar11) || NAN(fVar6))) {
      if ((fVar11 != fVar8) || (NAN(fVar11) || NAN(fVar8))) {
        fVar9 = (fVar6 - fVar8) / fVar10 + 4.0;
      }
      else {
        fVar9 = (fVar5 - fVar6) / fVar10 + 2.0;
      }
    }
    else {
      fVar9 = (fVar8 - fVar5) / fVar10 + 6.0;
    }
  }
  local_18._M_elems[0] = fmodf(fVar9,6.0);
  local_18._M_elems[0] = local_18._M_elems[0] / 6.0;
  local_18._M_elems[1] = (float)(~-(uint)(fVar11 == 0.0) & (uint)(fVar10 / fVar11));
  local_18._M_elems[2] = fVar11;
  local_18._M_elems[3] = (float)bVar1 / 255.0;
  updateCurrentColor(this,inputHsva,true,&local_18);
  return;
}

Assistant:

inline std::array<float, 4> normalizeRgb(const sf::Color& color) {
    return {color.r / 255.0f, color.g / 255.0f, color.b / 255.0f, color.a / 255.0f};
}